

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLog.c
# Opt level: O1

void Abc_NtkWriteLogFile(char *pFileName,Abc_Cex_t *pCex,int Status,int nFrames,char *pCommand)

{
  FILE *__s;
  uint uVar1;
  size_t __size;
  char *pcVar2;
  
  __s = fopen(pFileName,"w");
  if (__s == (FILE *)0x0) {
    printf("Cannot open log file for writing \"%s\".\n",pFileName);
    return;
  }
  if (Status == -1) {
    pcVar2 = "snl_UNK";
LAB_002d780f:
    __size = 7;
  }
  else {
    if (Status == 0) {
      pcVar2 = "snl_SAT";
      goto LAB_002d780f;
    }
    if (Status != 1) {
      puts("Abc_NtkWriteLogFile(): Cannot recognize solving status.");
      goto LAB_002d782f;
    }
    pcVar2 = "snl_UNSAT";
    __size = 9;
  }
  fwrite(pcVar2,__size,1,__s);
LAB_002d782f:
  fputc(0x20,__s);
  fprintf(__s,"%d",(ulong)(uint)nFrames);
  fputc(0x20,__s);
  pcVar2 = "unknown";
  if (pCommand != (char *)0x0) {
    pcVar2 = pCommand;
  }
  fputs(pcVar2,__s);
  if (Status == 0 && pCex != (Abc_Cex_t *)0x0) {
    fprintf(__s," %d",(ulong)(uint)pCex->iPo);
  }
  if ((pCex != (Abc_Cex_t *)0x0) && (pCex->iFrame != nFrames)) {
    fprintf(__s," %d");
  }
  fputc(10,__s);
  if (pCex == (Abc_Cex_t *)0x0) {
    fwrite("NULL",4,1,__s);
  }
  else if (0 < pCex->nRegs) {
    uVar1 = 0;
    do {
      fprintf(__s,"%d",(ulong)(((uint)(&pCex[1].iPo)[uVar1 >> 5] >> (uVar1 & 0x1f) & 1) != 0));
      uVar1 = uVar1 + 1;
    } while ((int)uVar1 < pCex->nRegs);
  }
  fputc(10,__s);
  if (pCex == (Abc_Cex_t *)0x0) {
    fwrite("NULL",4,1,__s);
  }
  else {
    uVar1 = pCex->nRegs;
    if (pCex->nBits - uVar1 != (pCex->iFrame + 1) * pCex->nPis) {
      __assert_fail("pCex->nBits - pCex->nRegs == pCex->nPis * (pCex->iFrame + 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcLog.c"
                    ,0x71,"void Abc_NtkWriteLogFile(char *, Abc_Cex_t *, int, int, char *)");
    }
    if ((int)uVar1 < pCex->nBits) {
      do {
        fprintf(__s,"%d",(ulong)(((uint)(&pCex[1].iPo)[(int)uVar1 >> 5] >> (uVar1 & 0x1f) & 1) != 0)
               );
        uVar1 = uVar1 + 1;
      } while ((int)uVar1 < pCex->nBits);
    }
  }
  fputc(10,__s);
  fclose(__s);
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

/*
    Log file format (Jiang, Mon, 28 Sep 2009;  updated by Alan in Jan 2011)

    <result> <bug_free_depth>  <engine_name> <0-based_output_num> <0-based_frame>
    <INIT_STATE> : default is empty line.
    <TRACE> : default is empty line
   
    <result> is one of the following: "snl_SAT", "snl_UNSAT", "snl_UNK", "snl_ABORT".
    <bug_free_depth> is the number of timeframes exhaustively explored without counter-examples
    <0-based_output_num> only need to be given if the problem is SAT.
    <0-based_frame> only need to be given if the problem is SAT and <0-based_frame> is different from <bug_free_depth>.   
    <INIT_STATE>  : initial state
    <TRACE> : input vector

    <INIT_STATE>and <TRACE> are strings of 0/1/- ( - means don't care). The length is equivalent to #input*#<cyc>.
*/


         



////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Abc_NtkWriteLogFile( char * pFileName, Abc_Cex_t * pCex, int Status, int nFrames, char * pCommand )
{
    FILE * pFile;
    int i;
    pFile = fopen( pFileName, "w" );
    if ( pFile == NULL )
    {
        printf( "Cannot open log file for writing \"%s\".\n" , pFileName );
        return;
    }
    // write <result>
    if ( Status == 1 )
        fprintf( pFile, "snl_UNSAT" );
    else if ( Status == 0 )
        fprintf( pFile, "snl_SAT" );
    else if ( Status == -1 )
        fprintf( pFile, "snl_UNK" );
    else 
        printf( "Abc_NtkWriteLogFile(): Cannot recognize solving status.\n" );
    fprintf( pFile, " " );
    // write <bug_free_depth>
    fprintf( pFile, "%d", nFrames );
    fprintf( pFile, " " );
    // write <engine_name>
    fprintf( pFile, "%s", pCommand ? pCommand : "unknown" );
    if ( pCex && Status == 0 )
        fprintf( pFile, " %d", pCex->iPo );
    // write <cyc>
    if ( pCex && pCex->iFrame != nFrames )
        fprintf( pFile, " %d", pCex->iFrame );
    fprintf( pFile, "\n" );
    // write <INIT_STATE>
    if ( pCex == NULL )
        fprintf( pFile, "NULL" );
    else
    {
        for ( i = 0; i < pCex->nRegs; i++ )
            fprintf( pFile, "%d", Abc_InfoHasBit(pCex->pData,i) );
    }
    fprintf( pFile, "\n" );
    // write <TRACE>
    if ( pCex == NULL )
        fprintf( pFile, "NULL" );
    else
    {
        assert( pCex->nBits - pCex->nRegs == pCex->nPis * (pCex->iFrame + 1) );
        for ( i = pCex->nRegs; i < pCex->nBits; i++ )
            fprintf( pFile, "%d", Abc_InfoHasBit(pCex->pData,i) );
    }
    fprintf( pFile, "\n" );
    fclose( pFile );
}